

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_12::CorruptionReporter::Corruption
          (CorruptionReporter *this,size_t bytes,Status *status)

{
  Status SStack_68;
  string local_60;
  string r;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&r,"corruption: ",(allocator<char> *)&local_60);
  AppendNumberTo(&r,bytes);
  std::__cxx11::string::append((char *)&r);
  Status::ToString_abi_cxx11_(&local_60,status);
  std::__cxx11::string::append((string *)&r);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::push_back((char)&r);
  local_60._M_dataplus._M_p._0_4_ = r._M_dataplus._M_p._0_4_;
  local_60._M_dataplus._M_p._4_4_ = r._M_dataplus._M_p._4_4_;
  local_60._M_string_length._0_4_ = (undefined4)r._M_string_length;
  local_60._M_string_length._4_4_ = r._M_string_length._4_4_;
  (*this->dst_->_vptr_WritableFile[2])(&SStack_68,this->dst_,&local_60);
  Status::~Status(&SStack_68);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }